

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

void __thiscall PSEngine::PSEngine(PSEngine *this,Config p_config,shared_ptr<PSLogger> *p_logger)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  PSLogger *__tmp;
  element_type *peVar4;
  
  this->m_config = p_config;
  peVar4 = (p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  p_Var2 = (p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
      peVar4 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  *(bool *)((long)&(this->m_compiled_game).prelude_info.title.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x20) = false;
  *(bool *)((long)&(this->m_compiled_game).prelude_info.author.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x20) = false;
  *(bool *)((long)&(this->m_compiled_game).prelude_info.homepage.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x20) = false;
  (this->m_compiled_game).prelude_info.realtime_interval.super__Optional_base<float,_true,_true>.
  _M_payload.super__Optional_payload_base<float>._M_engaged = false;
  p_Var1 = &(this->m_compiled_game).graphics_data._M_t._M_impl.super__Rb_tree_header;
  (this->m_compiled_game).graphics_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_compiled_game).graphics_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_compiled_game).graphics_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_compiled_game).graphics_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_compiled_game).graphics_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_compiled_game).objects._M_t._M_impl.super__Rb_tree_header;
  (this->m_compiled_game).objects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_compiled_game).objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_compiled_game).objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_compiled_game).objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  memset(&(this->m_compiled_game).objects._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xa8);
  (this->m_current_level).level_idx = -1;
  (this->m_current_level).size.x = 0;
  (this->m_current_level).size.y = 0;
  this->m_last_input = None;
  p_Var1 = &(this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_current_level).cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_current_level).cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_current_level).cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_level_state_stack).super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_level_state_stack).super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_level_state_stack).super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_operation_history).
  super__Vector_base<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_operation_history).
  super__Vector_base<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_operation_history).
  super__Vector_base<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_turn_history).subturns.
  super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_turn_history).was_turn_cancelled = false;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_single_char_obj_alias_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_is_level_won = false;
  this->m_current_tick_time_elapsed = 0.0;
  p_Var1 = &(this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_object_cache).m_content._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (peVar4 == (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "A Logger ptr was not passed to the engine constructor, construction a default one\n"
               ,0x52);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164710;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__PSLogger_00164c28;
    p_Var3[1]._M_use_count = 3;
    (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var3 + 1);
    p_Var2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      return;
    }
  }
  return;
}

Assistant:

PSEngine::PSEngine(Config p_config, shared_ptr<PSLogger> p_logger /*=nullptr*/) : m_config(p_config), m_logger(p_logger)
{
    if(m_logger == nullptr)
	{
		cout << "A Logger ptr was not passed to the engine constructor, construction a default one\n";
		m_logger = make_shared<PSLogger>(PSLogger());
	}
}